

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiTable * __thiscall ImPool<ImGuiTable>::Add(ImPool<ImGuiTable> *this)

{
  ImGuiTableSortSpecs *pIVar1;
  int iVar2;
  int iVar3;
  ImGuiTable *pIVar4;
  ImGuiTable *__dest;
  ImGuiID IVar5;
  ImGuiID IVar6;
  
  iVar2 = this->FreeIdx;
  if (iVar2 == (this->Buf).Size) {
    IVar5 = iVar2 + 1;
    iVar3 = (this->Buf).Capacity;
    if (iVar2 < iVar3) {
      __dest = (this->Buf).Data;
      IVar6 = IVar5;
    }
    else {
      if (iVar3 == 0) {
        IVar6 = 8;
      }
      else {
        IVar6 = iVar3 / 2 + iVar3;
      }
      if ((int)IVar6 <= (int)IVar5) {
        IVar6 = IVar5;
      }
      __dest = (ImGuiTable *)ImGui::MemAlloc((long)(int)IVar6 * 0x218);
      pIVar4 = (this->Buf).Data;
      if (pIVar4 != (ImGuiTable *)0x0) {
        memcpy(__dest,pIVar4,(long)(this->Buf).Size * 0x218);
        ImGui::MemFree((this->Buf).Data);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = IVar6;
      IVar6 = this->FreeIdx + 1;
    }
    (this->Buf).Size = IVar5;
  }
  else {
    __dest = (this->Buf).Data;
    IVar6 = __dest[iVar2].ID;
  }
  this->FreeIdx = IVar6;
  *(undefined4 *)&__dest[iVar2].SortSpecsSingle.field_0x8 = 0;
  pIVar4 = __dest + iVar2;
  (pIVar4->SortSpecsSingle).ColumnUserID = 0;
  (pIVar4->SortSpecsSingle).ColumnIndex = 0;
  (pIVar4->SortSpecsSingle).SortOrder = 0;
  pIVar1 = &__dest[iVar2].SortSpecs;
  pIVar1->Specs = (ImGuiTableColumnSortSpecs *)0x0;
  pIVar1->SpecsCount = 0;
  pIVar1->SpecsDirty = false;
  *(undefined3 *)&pIVar1->field_0xd = 0;
  memset(__dest + iVar2,0,0x218);
  __dest[iVar2].LastFrameActive = -1;
  this->AliveCount = this->AliveCount + 1;
  return (this->Buf).Data + iVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }